

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O2

int __thiscall pstore::region::mem_based_factory::init(mem_based_factory *this,EVP_PKEY_CTX *ctx)

{
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             (__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x18));
  factory::create<pstore::file::in_memory,pstore::in_memory_mapper>
            ((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)this,(factory *)ctx,(shared_ptr<pstore::file::in_memory> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return (int)this;
}

Assistant:

auto mem_based_factory::init () -> std::vector<memory_mapper_ptr> {
            return this->create<file::in_memory, in_memory_mapper> (file_);
        }